

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O3

void __thiscall Bounds2_IteratorDegenerate_Test::TestBody(Bounds2_IteratorDegenerate_Test *this)

{
  return;
}

Assistant:

TEST(Bounds2, IteratorDegenerate) {
    Bounds2i b{{0, 0}, {0, 10}};
    for (auto p : b) {
        // This loop should never run.
        bool reached = true;
        EXPECT_FALSE(reached) << "p = " << p;
        break;
    }

    Bounds2i b2{{0, 0}, {4, 0}};
    for (auto p : b2) {
        // This loop should never run.
        bool reached = true;
        EXPECT_FALSE(reached) << "p = " << p;
        break;
    }

    Bounds2i b3;
    for (auto p : b3) {
        // This loop should never run.
        bool reached = true;
        EXPECT_FALSE(reached) << "p = " << p;
        break;
    }
}